

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

void kmp_set_stacksize_s(size_t arg)

{
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  __kmp_acquire_ticket_lock(&__kmp_initz_lock,-2);
  if (__kmp_init_parallel == 0) {
    __kmp_stksize = 0x7fffffffffffffff;
    if (arg < 0x7fffffffffffffff) {
      __kmp_stksize = arg;
    }
    if (arg < __kmp_sys_min_stksize) {
      __kmp_stksize = __kmp_sys_min_stksize;
    }
    __kmp_env_stksize = 1;
  }
  __kmp_release_ticket_lock(&__kmp_initz_lock,-2);
  return;
}

Assistant:

void  FTN_STDCALL
FTN_SET_STACKSIZE_S( size_t KMP_DEREF arg )
{
    #ifdef KMP_STUB
        __kmps_set_stacksize( KMP_DEREF arg );
    #else
        // __kmp_aux_set_stacksize initializes the library if needed
        __kmp_aux_set_stacksize( KMP_DEREF arg );
    #endif
}